

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::DeleteStatusCase::test(DeleteStatusCase *this)

{
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  GLuint shaderProg;
  GLuint shaderFrag;
  GLuint shaderVert;
  DeleteStatusCase *this_local;
  
  shader = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader
                        (&(this->super_ApiCase).super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader,1,
             &Functional::(anonymous_namespace)::commonTestVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader_00,1,
             &Functional::(anonymous_namespace)::commonTestFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader,0x8b81,1);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader_00,0x8b81,1);
  program = glu::CallLogWrapper::glCreateProgram(&(this->super_ApiCase).super_CallLogWrapper);
  glu::CallLogWrapper::glAttachShader(&(this->super_ApiCase).super_CallLogWrapper,program,shader);
  glu::CallLogWrapper::glAttachShader(&(this->super_ApiCase).super_CallLogWrapper,program,shader_00)
  ;
  glu::CallLogWrapper::glLinkProgram(&(this->super_ApiCase).super_CallLogWrapper,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,program,0x8b82,1);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader,0x8b80,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader_00,0x8b80,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,program,0x8b80,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader,0x8b80,1);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,shader_00,0x8b80,1);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,program,0x8b80,1);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &commonTestVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &commonTestFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		verifyShaderParam(m_testCtx, *this, shaderVert, GL_COMPILE_STATUS, GL_TRUE);
		verifyShaderParam(m_testCtx, *this, shaderFrag, GL_COMPILE_STATUS, GL_TRUE);

		GLuint shaderProg = glCreateProgram();
		glAttachShader(shaderProg, shaderVert);
		glAttachShader(shaderProg, shaderFrag);
		glLinkProgram(shaderProg);
		expectError(GL_NO_ERROR);

		verifyProgramParam	(m_testCtx, *this, shaderProg, GL_LINK_STATUS, GL_TRUE);

		verifyShaderParam	(m_testCtx, *this, shaderVert, GL_DELETE_STATUS, GL_FALSE);
		verifyShaderParam	(m_testCtx, *this, shaderFrag, GL_DELETE_STATUS, GL_FALSE);
		verifyProgramParam	(m_testCtx, *this, shaderProg, GL_DELETE_STATUS, GL_FALSE);
		expectError(GL_NO_ERROR);

		glUseProgram(shaderProg);

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(shaderProg);
		expectError(GL_NO_ERROR);

		verifyShaderParam	(m_testCtx, *this, shaderVert, GL_DELETE_STATUS, GL_TRUE);
		verifyShaderParam	(m_testCtx, *this, shaderFrag, GL_DELETE_STATUS, GL_TRUE);
		verifyProgramParam	(m_testCtx, *this, shaderProg, GL_DELETE_STATUS, GL_TRUE);
		expectError(GL_NO_ERROR);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}